

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonHumanLifeFormAppearance.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::NonHumanLifeFormAppearance::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,NonHumanLifeFormAppearance *this)

{
  ostream *poVar1;
  KINT32 Value;
  KString local_1d0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  NonHumanLifeFormAppearance *local_18;
  NonHumanLifeFormAppearance *this_local;
  
  local_18 = this;
  this_local = (NonHumanLifeFormAppearance *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Non-Human Lifeform Appearance:");
  poVar1 = std::operator<<(poVar1,"\n\tDamage:               ");
  ENUMS::GetEnumAsStringEntityDamage_abi_cxx11_
            (&local_1d0,(ENUMS *)(ulong)((uint)*this >> 3 & 3),Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
  poVar1 = std::operator<<(poVar1,"\n\tFrozen Status:        ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0x15 & 1);
  poVar1 = std::operator<<(poVar1,"\n\tMounted/Hoisted:      ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0x16 & 1);
  poVar1 = std::operator<<(poVar1,"\n\tState:                ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0x17 & 1);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString NonHumanLifeFormAppearance::GetAsString() const
{
    KStringStream ss;

    ss << "Non-Human Lifeform Appearance:"
       << "\n\tDamage:               " << GetEnumAsStringEntityDamage( m_Damage )
       << "\n\tFrozen Status:        " << m_FrozenStatus
       << "\n\tMounted/Hoisted:      " << m_MountedHoisted
       << "\n\tState:                " << m_State
       << "\n";

    return ss.str();
}